

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict initializer_list(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  token_t ptVar2;
  undefined8 uVar3;
  bool bVar4;
  node_t_conflict n;
  node_t_conflict pnVar5;
  node_t_conflict n_00;
  node_t_conflict pnVar6;
  char *expected_name;
  int token_code;
  code *pcVar7;
  
  ppVar1 = c2m_ctx->parse_ctx;
  n = new_node(c2m_ctx,N_LIST);
  ptVar2 = ppVar1->curr_token;
  if (*(short *)ptVar2 == 0x7d) {
    pcVar7 = error;
    if (c2m_ctx->options->pedantic_p == 0) {
      pcVar7 = warning;
    }
    uVar3._0_4_ = (ptVar2->pos).lno;
    uVar3._4_4_ = (ptVar2->pos).ln_pos;
    (*pcVar7)(c2m_ctx,(ptVar2->pos).fname,uVar3,"empty initializer list");
    return n;
  }
LAB_00198ba6:
  pnVar5 = new_node(c2m_ctx,N_LIST);
  bVar4 = false;
  do {
    if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x5b) {
      read_token(c2m_ctx);
      n_00 = cond_expr(c2m_ctx,no_err_p);
      if (n_00 == &err_struct) goto LAB_00198d49;
      if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x5d) {
        if (ppVar1->record_level != 0) goto LAB_00198d49;
        token_code = 0x5d;
        goto LAB_00198d23;
      }
      read_token(c2m_ctx);
    }
    else {
      if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x2e) break;
      read_token(c2m_ctx);
      ptVar2 = c2m_ctx->parse_ctx->curr_token;
      if (*(short *)ptVar2 != 0x103) {
        if (ppVar1->record_level != 0) goto LAB_00198d49;
        expected_name = "identifier";
        goto LAB_00198d44;
      }
      pnVar6 = ptVar2->node;
      read_token(c2m_ctx);
      n_00 = new_node(c2m_ctx,N_FIELD_ID);
      op_append(c2m_ctx,n_00,pnVar6);
    }
    op_append(c2m_ctx,pnVar5,n_00);
    bVar4 = true;
  } while( true );
  if (bVar4) {
    if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x3d) {
      if (ppVar1->record_level == 0) {
        token_code = 0x3d;
LAB_00198d23:
        expected_name = get_token_name(c2m_ctx,token_code);
LAB_00198d44:
        syntax_error(c2m_ctx,expected_name);
      }
      goto LAB_00198d49;
    }
    read_token(c2m_ctx);
  }
  pnVar6 = initializer(c2m_ctx,no_err_p);
  if (pnVar6 != &err_struct) {
    pnVar5 = new_node2(c2m_ctx,N_INIT,pnVar5,pnVar6);
    op_append(c2m_ctx,n,pnVar5);
    if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x2c) {
      return n;
    }
    read_token(c2m_ctx);
    if (*(short *)ppVar1->curr_token == 0x7d) {
      return n;
    }
    goto LAB_00198ba6;
  }
LAB_00198d49:
  return &err_struct;
}

Assistant:

D (initializer_list) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, list2, r;
  int first_p;

  list = new_node (c2m_ctx, N_LIST);
  if (C ('}')) {
    (c2m_options->pedantic_p ? error : warning) (c2m_ctx, curr_token->pos,
                                                 "empty initializer list");
    return list;
  }
  for (;;) { /* designation */
    list2 = new_node (c2m_ctx, N_LIST);
    for (first_p = TRUE;; first_p = FALSE) { /* designator-list, designator */
      if (M ('[')) {
        P (const_expr);
        PT (']');
      } else if (M ('.')) {
        PTN (T_ID);
        r = new_node1 (c2m_ctx, N_FIELD_ID, r);
      } else
        break;
      op_append (c2m_ctx, list2, r);
    }
    if (!first_p) {
      PT ('=');
    }
    P (initializer);
    op_append (c2m_ctx, list, new_node2 (c2m_ctx, N_INIT, list2, r));
    if (!M (',')) break;
    if (C ('}')) break;
  }
  return list;
}